

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightsamplers.cpp
# Opt level: O0

void __thiscall
pbrt::PowerLightSampler::PowerLightSampler
          (PowerLightSampler *this,span<const_pbrt::Light> lights,Allocator alloc)

{
  Allocator alloc_00;
  SampledSpectrum a;
  SampledWavelengths lambda_00;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  bool bVar7;
  size_t sVar8;
  iterator pLVar9;
  iterator __first;
  iterator __last;
  float fVar10;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *pvVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined1 in_ZMM1 [64];
  SampledSpectrum SVar14;
  SampledSpectrum phi;
  Light *light;
  iterator __end1;
  iterator __begin1;
  span<const_pbrt::Light> *__range1;
  SampledWavelengths lambda;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> lightPower;
  size_t i;
  HashMap<pbrt::Light,_unsigned_long,_std::hash<pbrt::Light>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::Light,_unsigned_long>_>_>_>
  *in_stack_fffffffffffffd78;
  polymorphic_allocator<pstd::optional<std::pair<pbrt::Light,_unsigned_long>_>_>
  in_stack_fffffffffffffd80;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd90;
  float in_stack_fffffffffffffd94;
  Light *in_stack_fffffffffffffd98;
  vector<pbrt::Light,_pstd::pmr::polymorphic_allocator<pbrt::Light>_> *in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdac;
  HashMap<pbrt::Light,_unsigned_long,_std::hash<pbrt::Light>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::Light,_unsigned_long>_>_>_>
  *in_stack_fffffffffffffdb0;
  undefined8 in_stack_fffffffffffffdb8;
  iterator local_a8;
  HashMap<pbrt::Light,_unsigned_long,_std::hash<pbrt::Light>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::Light,_unsigned_long>_>_>_>
  *local_98;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *pvStack_90;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *pvStack_88;
  undefined8 uStack_80;
  polymorphic_allocator<float> in_stack_ffffffffffffff88;
  Allocator in_stack_ffffffffffffff90;
  span<const_float> in_stack_ffffffffffffff98;
  size_t local_50;
  span<const_pbrt::Light> local_10;
  
  pstd::span<const_pbrt::Light>::begin(&local_10);
  pstd::span<const_pbrt::Light>::end(&local_10);
  pstd::pmr::polymorphic_allocator<pbrt::Light>::polymorphic_allocator<std::byte>
            ((polymorphic_allocator<pbrt::Light> *)in_stack_fffffffffffffd80.memoryResource,
             (polymorphic_allocator<std::byte> *)in_stack_fffffffffffffd78);
  pstd::vector<pbrt::Light,pstd::pmr::polymorphic_allocator<pbrt::Light>>::
  vector<pbrt::Light_const*>
            (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
             (Light *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
             (polymorphic_allocator<pbrt::Light> *)in_stack_fffffffffffffd88);
  pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::Light,_unsigned_long>_>_>::
  polymorphic_allocator<std::byte>
            ((polymorphic_allocator<pstd::optional<std::pair<pbrt::Light,_unsigned_long>_>_> *)
             in_stack_fffffffffffffd80.memoryResource,
             (polymorphic_allocator<std::byte> *)in_stack_fffffffffffffd78);
  HashMap<pbrt::Light,_unsigned_long,_std::hash<pbrt::Light>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::Light,_unsigned_long>_>_>_>
  ::HashMap(in_stack_fffffffffffffd78,in_stack_fffffffffffffd80);
  alloc_00.memoryResource._4_4_ = in_stack_fffffffffffffd94;
  alloc_00.memoryResource._0_4_ = in_stack_fffffffffffffd90;
  AliasTable::AliasTable((AliasTable *)in_stack_fffffffffffffd88,alloc_00);
  bVar7 = pstd::span<const_pbrt::Light>::empty((span<const_pbrt::Light> *)0x8de2ab);
  if (!bVar7) {
    for (local_50 = 0; sVar8 = pstd::span<const_pbrt::Light>::size(&local_10), local_50 < sVar8;
        local_50 = local_50 + 1) {
      pstd::span<const_pbrt::Light>::operator[](&local_10,local_50);
      HashMap<pbrt::Light,_unsigned_long,_std::hash<pbrt::Light>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::Light,_unsigned_long>_>_>_>
      ::Insert(in_stack_fffffffffffffdb0,
               (Light *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
               (unsigned_long *)in_stack_fffffffffffffda0);
    }
    pstd::pmr::polymorphic_allocator<float>::polymorphic_allocator
              ((polymorphic_allocator<float> *)in_stack_fffffffffffffd80.memoryResource);
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector
              ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)&stack0xffffffffffffff90,
               (polymorphic_allocator<float> *)&stack0xffffffffffffff88);
    SampledWavelengths::SampleVisible(in_stack_fffffffffffffd94);
    local_a8 = pstd::span<const_pbrt::Light>::begin(&local_10);
    pLVar9 = pstd::span<const_pbrt::Light>::end(&local_10);
    for (; local_a8 != pLVar9; local_a8 = local_a8 + 1) {
      in_stack_fffffffffffffd90 = (undefined4)uStack_80;
      in_stack_fffffffffffffd94 = (float)((ulong)uStack_80 >> 0x20);
      uVar12 = in_ZMM1._8_8_;
      lambda_00.lambda.values[2] = (float)in_stack_fffffffffffffda8;
      lambda_00.lambda.values._0_8_ = in_stack_fffffffffffffda0;
      lambda_00.lambda.values[3] = (float)in_stack_fffffffffffffdac;
      lambda_00.pdf.values._0_8_ = in_stack_fffffffffffffdb0;
      lambda_00.pdf.values[2] = (float)(int)in_stack_fffffffffffffdb8;
      lambda_00.pdf.values[3] = (float)(int)((ulong)in_stack_fffffffffffffdb8 >> 0x20);
      pvVar11 = pvStack_90;
      in_stack_fffffffffffffd78 = local_98;
      in_stack_fffffffffffffd80.memoryResource = (memory_resource *)pvStack_90;
      in_stack_fffffffffffffd88 = pvStack_88;
      SVar14 = Light::Phi((Light *)pvStack_90,lambda_00);
      auVar5._8_8_ = uVar12;
      auVar5._0_8_ = SVar14.values.values._8_8_;
      auVar6._8_8_ = pvVar11;
      auVar6._0_8_ = SVar14.values.values._0_8_;
      vmovlpd_avx(auVar6);
      vmovlpd_avx(auVar5);
      SVar14 = SampledWavelengths::PDF
                         ((SampledWavelengths *)in_stack_fffffffffffffd80.memoryResource);
      auVar3._8_8_ = pvVar11;
      auVar3._0_8_ = SVar14.values.values._8_8_;
      auVar4._8_8_ = uVar12;
      auVar4._0_8_ = SVar14.values.values._0_8_;
      vmovlpd_avx(auVar4);
      vmovlpd_avx(auVar3);
      uVar12 = 0;
      uVar13 = 0;
      a.values.values._8_8_ = in_stack_fffffffffffffda0;
      a.values.values._0_8_ = in_stack_fffffffffffffd98;
      SVar14.values.values[2] = (float)in_stack_fffffffffffffd90;
      SVar14.values.values._0_8_ = in_stack_fffffffffffffd88;
      SVar14.values.values[3] = in_stack_fffffffffffffd94;
      SVar14 = SafeDiv(a,SVar14);
      auVar1._8_8_ = uVar13;
      auVar1._0_8_ = SVar14.values.values._8_8_;
      auVar2._8_8_ = uVar12;
      auVar2._0_8_ = SVar14.values.values._0_8_;
      in_ZMM1 = ZEXT1664(auVar2);
      vmovlpd_avx(auVar2);
      vmovlpd_avx(auVar1);
      SampledSpectrum::Average((SampledSpectrum *)in_stack_fffffffffffffd80.memoryResource);
      pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::push_back
                ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                 CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                 (float *)in_stack_fffffffffffffd88);
    }
    __first = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::begin
                        ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                         &stack0xffffffffffffff90);
    __last = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::end
                       ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                        &stack0xffffffffffffff90);
    fVar10 = std::accumulate<float*,float>(__first,__last,0.0);
    if ((fVar10 == 0.0) && (!NAN(fVar10))) {
      pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::begin
                ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)&stack0xffffffffffffff90
                );
      pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::end
                ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)&stack0xffffffffffffff90
                );
      std::fill<float*,float>
                ((float *)in_stack_fffffffffffffd80.memoryResource,
                 (float *)in_stack_fffffffffffffd78,(float *)0x8de699);
    }
    pstd::span<float_const>::
    span<pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>,void,pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>>
              ((span<const_float> *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
               in_stack_fffffffffffffd88);
    AliasTable::AliasTable
              ((AliasTable *)in_stack_ffffffffffffff88.memoryResource,in_stack_ffffffffffffff98,
               in_stack_ffffffffffffff90);
    AliasTable::operator=
              ((AliasTable *)in_stack_fffffffffffffd80.memoryResource,
               (AliasTable *)in_stack_fffffffffffffd78);
    AliasTable::~AliasTable((AliasTable *)0x8de711);
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
              ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
               in_stack_fffffffffffffd80.memoryResource);
  }
  return;
}

Assistant:

PowerLightSampler::PowerLightSampler(pstd::span<const Light> lights, Allocator alloc)
    : lights(lights.begin(), lights.end(), alloc),
      lightToIndex(alloc),
      aliasTable(alloc) {
    if (lights.empty())
        return;
    // Initialize _lightToIndex_ hash table
    for (size_t i = 0; i < lights.size(); ++i)
        lightToIndex.Insert(lights[i], i);

    // Compute lights' power and initialize alias table
    pstd::vector<Float> lightPower;
    SampledWavelengths lambda = SampledWavelengths::SampleVisible(0.5f);
    for (const auto &light : lights) {
        SampledSpectrum phi = SafeDiv(light.Phi(lambda), lambda.PDF());
        lightPower.push_back(phi.Average());
    }
    if (std::accumulate(lightPower.begin(), lightPower.end(), 0.f) == 0.f)
        std::fill(lightPower.begin(), lightPower.end(), 1.f);
    aliasTable = AliasTable(lightPower, alloc);
}